

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O3

int __thiscall NetOptimize::fuse_memorydata_binaryop(NetOptimize *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar1;
  pointer ppLVar2;
  pointer ppLVar3;
  pointer ppLVar4;
  Layer *pLVar5;
  int *piVar6;
  Layer *pLVar7;
  Layer *pLVar8;
  long lVar9;
  int iVar10;
  undefined4 uVar11;
  int iVar12;
  pointer piVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  pointer piVar17;
  pointer __src;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  
  pvVar1 = (this->super_ModelWriter).layers;
  ppLVar2 = (pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppLVar3 = (pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  lVar20 = (long)ppLVar3 - (long)ppLVar2;
  if (lVar20 != 0) {
    uVar21 = lVar20 >> 3;
    lVar20 = 0;
    do {
      iVar10 = std::__cxx11::string::compare
                         ((char *)&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[lVar20]->type);
      if (iVar10 == 0) {
        iVar10 = *((((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar20]->tops).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        uVar22 = lVar20 + 1;
        if (uVar22 < uVar21) {
          do {
            iVar12 = std::__cxx11::string::compare
                               ((char *)&(((this->super_ModelWriter).layers)->
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar22]->type);
            if (((iVar12 == 0) &&
                (pLVar5 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar22],
                piVar6 = (pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)*(pointer *)
                       ((long)&(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl + 8) - (long)piVar6 == 8)) &&
               ((*piVar6 == iVar10 || (piVar6[1] == iVar10)))) goto LAB_00149efe;
            uVar22 = uVar22 + 1;
          } while (uVar22 < uVar21);
        }
        else {
LAB_00149efe:
          if (uVar22 != uVar21) {
            ppLVar4 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar5 = ppLVar4[lVar20];
            if (((*(int *)&pLVar5[1]._vptr_Layer == 1) &&
                (*(int *)((long)&pLVar5[1]._vptr_Layer + 4) == 0)) &&
               (iVar12._0_1_ = pLVar5[1].one_blob_only, iVar12._1_1_ = pLVar5[1].support_inplace,
               iVar12._2_1_ = pLVar5[1].support_vulkan, iVar12._3_1_ = pLVar5[1].support_packing,
               iVar12 == 0)) {
              pLVar5 = ppLVar4[uVar22];
              if (*(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start == iVar10) {
                uVar14 = *(uint *)&pLVar5[1]._vptr_Layer;
                if (5 < uVar14) goto LAB_00149f34;
                if ((0x35U >> (uVar14 & 0x1f) & 1) == 0) {
                  uVar11 = 7;
                  if (uVar14 != 1) {
                    uVar11 = 8;
                  }
                  *(undefined4 *)&pLVar5[1]._vptr_Layer = uVar11;
                }
              }
              fuse_memorydata_binaryop();
            }
          }
        }
      }
LAB_00149f34:
      lVar20 = lVar20 + 1;
    } while (lVar20 != uVar21 + (uVar21 == 0));
    if (ppLVar3 != ppLVar2) {
      uVar22 = 0;
      do {
        iVar10 = std::__cxx11::string::compare
                           ((char *)&(((this->super_ModelWriter).layers)->
                                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start[uVar22]->type);
        if (iVar10 == 0) {
          uVar15 = uVar22 + 1;
          uVar19 = uVar22;
          if (uVar15 < uVar21) {
            iVar10 = *((((this->super_ModelWriter).layers)->
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar22]->tops).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            do {
              iVar12 = std::__cxx11::string::compare
                                 ((char *)&(((this->super_ModelWriter).layers)->
                                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start[uVar15]->type)
              ;
              if (((iVar12 == 0) &&
                  (pLVar5 = (((this->super_ModelWriter).layers)->
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                            _M_impl.super__Vector_impl_data._M_start[uVar15],
                  piVar6 = (pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                  (long)*(pointer *)
                         ((long)&(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl + 8) - (long)piVar6 == 4)) && (*piVar6 == iVar10)) {
                uVar19 = uVar15 - 1;
                goto LAB_0014a04e;
              }
              uVar15 = uVar15 + 1;
            } while (uVar21 != uVar15);
          }
          else {
LAB_0014a04e:
            if (uVar15 != uVar21) {
              uVar19 = uVar19 + 2;
              lVar20 = -1;
              if (uVar19 < uVar21) {
                do {
                  iVar10 = std::__cxx11::string::compare
                                     ((char *)&(((this->super_ModelWriter).layers)->
                                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar19]->
                                               type);
                  if (iVar10 == 0) {
                    ppLVar2 = (((this->super_ModelWriter).layers)->
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                              _M_impl.super__Vector_impl_data._M_start;
                    pLVar5 = ppLVar2[uVar19];
                    piVar6 = (pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start;
                    if ((long)*(pointer *)
                               ((long)&(pLVar5->bottoms).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
                        (long)piVar6 == 8) {
                      pLVar5 = ppLVar2[uVar15];
                      lVar16 = *(long *)&(pLVar5->tops).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data;
                      uVar14 = (uint)((ulong)((long)*(pointer *)
                                                     ((long)&(pLVar5->tops).
                                                                                                                          
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) - lVar16) >> 2);
                      if (0 < (int)uVar14) {
                        lVar20 = 0;
                        uVar18 = 0;
                        do {
                          iVar10 = *(int *)(lVar16 + uVar18 * 4);
                          if ((*piVar6 == iVar10) || (piVar6[1] == iVar10)) {
                            lVar20 = lVar20 >> 0x20;
                            goto LAB_0014a106;
                          }
                          uVar18 = uVar18 + 1;
                          lVar20 = lVar20 + 0x100000000;
                        } while ((uVar14 & 0x7fffffff) != uVar18);
                      }
                    }
                  }
                  uVar19 = uVar19 + 1;
                } while (uVar19 != uVar21);
              }
              else {
LAB_0014a106:
                if (uVar19 != uVar21) {
                  ppLVar2 = (((this->super_ModelWriter).layers)->
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                            _M_impl.super__Vector_impl_data._M_start;
                  pLVar5 = ppLVar2[uVar22];
                  if (((*(int *)&pLVar5[1]._vptr_Layer == 1) &&
                      (*(int *)((long)&pLVar5[1]._vptr_Layer + 4) == 0)) &&
                     (iVar10._0_1_ = pLVar5[1].one_blob_only,
                     iVar10._1_1_ = pLVar5[1].support_inplace,
                     iVar10._2_1_ = pLVar5[1].support_vulkan,
                     iVar10._3_1_ = pLVar5[1].support_packing, iVar10 == 0)) {
                    pLVar7 = ppLVar2[uVar15];
                    pLVar8 = ppLVar2[uVar19];
                    if (*(pLVar8->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start ==
                        *(int *)(*(long *)&(pLVar7->tops).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data + lVar20 * 4)) {
                      uVar14 = *(uint *)&pLVar8[1]._vptr_Layer;
                      if (5 < uVar14) goto LAB_0014a165;
                      if ((0x35U >> (uVar14 & 0x1f) & 1) == 0) {
                        uVar11 = 7;
                        if (uVar14 != 1) {
                          uVar11 = 8;
                        }
                        *(undefined4 *)&pLVar8[1]._vptr_Layer = uVar11;
                      }
                      lVar16 = 0;
                    }
                    else {
                      lVar16 = 1;
                    }
                    uVar11 = **(undefined4 **)&pLVar5[1].support_tensor_storage;
                    *(undefined4 *)((long)&pLVar8[1]._vptr_Layer + 4) = 1;
                    pLVar8[1].one_blob_only = (bool)(char)uVar11;
                    pLVar8[1].support_inplace = (bool)(char)((uint)uVar11 >> 8);
                    pLVar8[1].support_vulkan = (bool)(char)((uint)uVar11 >> 0x10);
                    pLVar8[1].support_packing = (bool)(char)((uint)uVar11 >> 0x18);
                    fprintf(_stderr,"fuse_memorydata_binaryop %s %s\n",
                            (pLVar5->name)._M_dataplus._M_p,(pLVar8->name)._M_dataplus._M_p);
                    lVar9 = *(long *)&(pLVar8->bottoms).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data;
                    piVar13 = *(pointer *)
                               ((long)&(pLVar8->bottoms).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
                    piVar17 = (pointer)(lVar9 + lVar16 * 4 + 4);
                    if (piVar17 != piVar13) {
                      memmove((void *)(lVar9 + lVar16 * 4),piVar17,(long)piVar13 - (long)piVar17);
                      piVar13 = *(pointer *)
                                 ((long)&(pLVar8->bottoms).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
                    }
                    *(pointer *)
                     ((long)&(pLVar8->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl
                     + 8) = piVar13 + -1;
                    piVar13 = (pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    piVar17 = *(pointer *)
                               ((long)&(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl + 8);
                    __src = piVar13 + lVar20 + 1;
                    if (__src != piVar17) {
                      memmove(piVar13 + lVar20,__src,(long)piVar17 - (long)__src);
                      piVar13 = (pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_start;
                      piVar17 = *(pointer *)
                                 ((long)&(pLVar7->tops).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
                    }
                    *(pointer *)
                     ((long)&(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl +
                     8) = piVar17 + -1;
                    if (piVar13 == piVar17 + -1) {
                      std::__cxx11::string::operator=((string *)&pLVar7->type,"ncnnfused");
                      std::__cxx11::string::operator=((string *)&pLVar5->type,"ncnnfused");
                    }
                    uVar22 = uVar22 - 1;
                  }
                }
              }
            }
          }
        }
LAB_0014a165:
        uVar22 = uVar22 + 1;
      } while (uVar22 < uVar21);
    }
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_memorydata_binaryop()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "MemoryData")
            continue;

        // MemoryData - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index || layers[j]->bottoms[1] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse MemoryData - BinaryOp to BinaryOp
        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[i];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        if (memorydata->w != 1 || memorydata->h != 0 || memorydata->c != 0)
        {
            // not a scalar
            continue;
        }

        int memorydata_index = 1;

        if (binaryop->bottoms[0] == top_blob_index)
        {
            int op_type = binaryop->op_type;

            if (op_type == ncnn::BinaryOp::Operation_ADD
                    || op_type == ncnn::BinaryOp::Operation_MUL
                    || op_type == ncnn::BinaryOp::Operation_MAX
                    || op_type == ncnn::BinaryOp::Operation_MIN)
            {
                memorydata_index = 0;
            }
            else if (op_type == ncnn::BinaryOp::Operation_SUB)
            {
                binaryop->op_type = ncnn::BinaryOp::Operation_RSUB;
                memorydata_index = 0;
            }
            else if (op_type == ncnn::BinaryOp::Operation_DIV)
            {
                binaryop->op_type = ncnn::BinaryOp::Operation_RDIV;
                memorydata_index = 0;
            }
            else
            {
                // non interchangeable binaryop
                continue;
            }
        }

        float scalar = memorydata->data[0];

        binaryop->with_scalar = 1;
        binaryop->b = scalar;

        fprintf(stderr, "fuse_memorydata_binaryop %s %s\n", memorydata->name.c_str(), binaryop->name.c_str());

        binaryop->bottoms.erase(binaryop->bottoms.begin() + memorydata_index);
        memorydata->type = "ncnnfused";
    }

    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "MemoryData")
            continue;

        // MemoryData - Split - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j0 = i + 1;
        for (; j0 < layer_count; j0++)
        {
            if (layers[j0]->type != "Split")
                continue;

            if (layers[j0]->bottoms.size() != 1)
                continue;

            if (layers[j0]->bottoms[0] == top_blob_index)
                break;
        }

        if (j0 == layer_count)
            continue;

        int split_top_blob_index = -1;

        size_t j1 = j0 + 1;
        for (; j1 < layer_count; j1++)
        {
            if (layers[j1]->type != "BinaryOp")
                continue;

            if (layers[j1]->bottoms.size() != 2)
                continue;

            for (int k = 0; k < (int)layers[j0]->tops.size(); k++)
            {
                if (layers[j1]->bottoms[0] == layers[j0]->tops[k] || layers[j1]->bottoms[1] == layers[j0]->tops[k])
                {
                    split_top_blob_index = k;
                    break;
                }
            }

            if (split_top_blob_index != -1)
                break;
        }

        if (j1 == layer_count)
            continue;

        // fuse MemoryData - Split - BinaryOp to BinaryOp
        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[i];
        ncnn::Split* split = (ncnn::Split*)layers[j0];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j1];

        if (memorydata->w != 1 || memorydata->h != 0 || memorydata->c != 0)
        {
            // not a scalar
            continue;
        }

        int memorydata_index = 1;

        if (binaryop->bottoms[0] == split->tops[split_top_blob_index])
        {
            int op_type = binaryop->op_type;

            if (op_type == ncnn::BinaryOp::Operation_ADD
                    || op_type == ncnn::BinaryOp::Operation_MUL
                    || op_type == ncnn::BinaryOp::Operation_MAX
                    || op_type == ncnn::BinaryOp::Operation_MIN)
            {
                memorydata_index = 0;
            }
            else if (op_type == ncnn::BinaryOp::Operation_SUB)
            {
                binaryop->op_type = ncnn::BinaryOp::Operation_RSUB;
                memorydata_index = 0;
            }
            else if (op_type == ncnn::BinaryOp::Operation_DIV)
            {
                binaryop->op_type = ncnn::BinaryOp::Operation_RDIV;
                memorydata_index = 0;
            }
            else
            {
                // non interchangeable binaryop
                continue;
            }
        }

        float scalar = memorydata->data[0];

        binaryop->with_scalar = 1;
        binaryop->b = scalar;

        fprintf(stderr, "fuse_memorydata_binaryop %s %s\n", memorydata->name.c_str(), binaryop->name.c_str());

        binaryop->bottoms.erase(binaryop->bottoms.begin() + memorydata_index);
        split->tops.erase(split->tops.begin() + split_top_blob_index);
        if (split->tops.empty())
        {
            split->type = "ncnnfused";
            memorydata->type = "ncnnfused";
        }

        i--;
    }

    return 0;
}